

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUTestApprovals.h
# Opt level: O0

void __thiscall
ApprovalTests::ApprovalTestsCppUTestPlugin::preTestAction
          (ApprovalTestsCppUTestPlugin *this,UtestShell *shell,TestResult *result)

{
  TestPassedNotification *notification;
  pointer __args;
  TestResult *in_RDX;
  UtestShell *in_RSI;
  TestPlugin *in_RDI;
  pointer in_stack_fffffffffffffec8;
  TestName *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffee0;
  function<void_()> *this_00;
  string *in_stack_fffffffffffffee8;
  TestName *in_stack_fffffffffffffef0;
  undefined1 local_b8 [64];
  string local_78 [64];
  string local_38 [32];
  TestResult *local_18;
  UtestShell *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  notification = (TestPassedNotification *)
                 operator_new((size_t)in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,
                              0x1120cb);
  TestName::TestName(in_stack_fffffffffffffed0);
  ::std::unique_ptr<ApprovalTests::TestName,_std::default_delete<ApprovalTests::TestName>_>::reset
            ((unique_ptr<ApprovalTests::TestName,_std::default_delete<ApprovalTests::TestName>_> *)
             in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  ::std::unique_ptr<ApprovalTests::TestName,_std::default_delete<ApprovalTests::TestName>_>::
  operator->((unique_ptr<ApprovalTests::TestName,_std::default_delete<ApprovalTests::TestName>_> *)
             0x1120f1);
  UtestShell::getFile((UtestShell *)in_stack_fffffffffffffec8);
  cppUTestToString_abi_cxx11_((SimpleString *)in_RDI);
  TestName::setFileName(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  ::std::__cxx11::string::~string(local_38);
  SimpleString::~SimpleString((SimpleString *)0x112152);
  ::std::unique_ptr<ApprovalTests::TestName,_std::default_delete<ApprovalTests::TestName>_>::
  operator->((unique_ptr<ApprovalTests::TestName,_std::default_delete<ApprovalTests::TestName>_> *)
             0x112160);
  UtestShell::getGroup((UtestShell *)in_stack_fffffffffffffec8);
  cppUTestToString_abi_cxx11_((SimpleString *)in_RDI);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  ::std::__cxx11::string::~string(local_78);
  SimpleString::~SimpleString((SimpleString *)0x1121c1);
  __args = ::std::unique_ptr<ApprovalTests::TestName,_std::default_delete<ApprovalTests::TestName>_>
           ::operator->((unique_ptr<ApprovalTests::TestName,_std::default_delete<ApprovalTests::TestName>_>
                         *)0x1121cf);
  this_00 = (function<void_()> *)local_b8;
  UtestShell::getName((UtestShell *)in_stack_fffffffffffffec8);
  cppUTestToString_abi_cxx11_((SimpleString *)in_RDI);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args)
  ;
  ::std::__cxx11::string::~string((string *)(local_b8 + 0x10));
  SimpleString::~SimpleString((SimpleString *)0x112230);
  ::std::unique_ptr<ApprovalTests::TestName,_std::default_delete<ApprovalTests::TestName>_>::get
            ((unique_ptr<ApprovalTests::TestName,_std::default_delete<ApprovalTests::TestName>_> *)
             in_stack_fffffffffffffed0);
  FrameworkIntegrations::setCurrentTest((TestName *)0x112246);
  ::std::function<void()>::
  function<ApprovalTests::ApprovalTestsCppUTestPlugin::preTestAction(UtestShell&,TestResult&)::_lambda()_1_,void>
            (this_00,(anon_class_1_0_00000001 *)__args);
  FrameworkIntegrations::setTestPassedNotification(notification);
  ::std::function<void_()>::~function((function<void_()> *)0x112270);
  TestPlugin::preTestAction(in_RDI,local_10,local_18);
  return;
}

Assistant:

void preTestAction(UtestShell& shell, TestResult& result) override
        {
            currentTest.reset(new ApprovalTests::TestName);
            currentTest->setFileName(cppUTestToString(shell.getFile()));

            currentTest->sections.emplace_back(cppUTestToString(shell.getGroup()));
            currentTest->sections.emplace_back(cppUTestToString(shell.getName()));

            ApprovalTests::FrameworkIntegrations::setCurrentTest(currentTest.get());
            ApprovalTests::FrameworkIntegrations::setTestPassedNotification(
                []() { CHECK_TRUE(true); });
            TestPlugin::preTestAction(shell, result);
        }